

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O1

int Ssc_GiaResimulateOneClass(Ssc_Man_t *p,int iRepr,int iObj)

{
  Gia_Man_t *p_00;
  uint uVar1;
  int iVar2;
  
  p_00 = p->pAig;
  if (((uint)p_00->pReprs[iObj] & 0xfffffff) != iRepr) {
    __assert_fail("iRepr == Gia_ObjRepr(p->pAig, iObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,199,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
  }
  if (((~(uint)p_00->pReprs[iRepr] & 0xfffffff) == 0) && (0 < p_00->pNexts[iRepr])) {
    Gia_ManIncrementTravId(p_00);
    if (((~(uint)p->pAig->pReprs[iRepr] & 0xfffffff) == 0) && (0 < p->pAig->pNexts[iRepr])) {
      uVar1 = iRepr;
      if (iRepr != 0) {
        do {
          if (((int)uVar1 < 0) || (p->pAig->nObjs <= (int)uVar1)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          Ssc_GiaSimulatePattern_rec(p,p->pAig->pObjs + uVar1);
          uVar1 = p->pAig->pNexts[uVar1];
        } while (uVar1 != 0);
      }
      iVar2 = Ssc_GiaSimClassRefineOneBit(p->pAig,iRepr);
      if (((uint)p->pAig->pReprs[iObj] & 0xfffffff) == iRepr) {
        __assert_fail("iRepr != Gia_ObjRepr(p->pAig, iObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                      ,0xd0,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
      }
      return iVar2;
    }
    __assert_fail("Gia_ObjIsHead(p->pAig, iRepr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0xcb,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
  }
  __assert_fail("Gia_ObjIsHead( p->pAig, iRepr )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                ,200,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
}

Assistant:

int Ssc_GiaResimulateOneClass( Ssc_Man_t * p, int iRepr, int iObj )
{
    int Ent, RetValue;
    assert( iRepr == Gia_ObjRepr(p->pAig, iObj) );
    assert( Gia_ObjIsHead( p->pAig, iRepr ) );
    // set bit-values at the nodes according to the counter-example
    Gia_ManIncrementTravId( p->pAig );
    Gia_ClassForEachObj( p->pAig, iRepr, Ent )
        Ssc_GiaSimulatePattern_rec( p, Gia_ManObj(p->pAig, Ent) );
    // refine one class using these bit-values
    RetValue = Ssc_GiaSimClassRefineOneBit( p->pAig, iRepr );
    // check that the candidate equivalence is indeed refined
    assert( iRepr != Gia_ObjRepr(p->pAig, iObj) );
    return RetValue;
}